

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void negotiate(connectdata *conn)

{
  int iVar1;
  HTTP *pHVar2;
  HTTP *pHVar3;
  long lVar4;
  
  pHVar2 = (conn->data->state).proto.http;
  lVar4 = 0;
  do {
    if (lVar4 != 1) {
      if (*(int *)((long)&pHVar2[0xf].postdata + lVar4 * 4) == 1) {
        pHVar3 = (conn->data->state).proto.http;
        iVar1 = *(int *)((long)&pHVar3->postsize + lVar4 * 4);
        if (iVar1 == 3) {
          if (*(int *)((long)&pHVar3[7].form.fread_func + lVar4 * 4) == 0) {
            *(undefined4 *)((long)&pHVar3[7].form.fread_func + lVar4 * 4) = 1;
          }
        }
        else if (iVar1 == 2) {
          if (*(int *)((long)&pHVar3[7].form.fread_func + lVar4 * 4) == 1) {
            *(undefined4 *)((long)&pHVar3[7].form.fread_func + lVar4 * 4) = 0;
          }
        }
        else if (iVar1 == 0) {
          *(undefined4 *)((long)&pHVar3->postsize + lVar4 * 4) = 2;
          send_negotiation(conn,0xfb,(int)lVar4);
        }
      }
      if (*(int *)((long)&pHVar2[0x25].backup.fread_in + lVar4 * 4) == 1) {
        pHVar3 = (conn->data->state).proto.http;
        iVar1 = *(int *)((long)&pHVar3[0x16].backup.fread_func + lVar4 * 4);
        if (iVar1 == 3) {
          if (*(int *)((long)&pHVar3[0x1e].p_pragma + lVar4 * 4) == 0) {
            *(undefined4 *)((long)&pHVar3[0x1e].p_pragma + lVar4 * 4) = 1;
          }
        }
        else if (iVar1 == 2) {
          if (*(int *)((long)&pHVar3[0x1e].p_pragma + lVar4 * 4) == 1) {
            *(undefined4 *)((long)&pHVar3[0x1e].p_pragma + lVar4 * 4) = 0;
          }
        }
        else if (iVar1 == 0) {
          *(undefined4 *)((long)&pHVar3[0x16].backup.fread_func + lVar4 * 4) = 2;
          send_negotiation(conn,0xfd,(int)lVar4);
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x28);
  return;
}

Assistant:

static void negotiate(struct connectdata *conn)
{
  int i;
  struct TELNET *tn = (struct TELNET *) conn->data->state.proto.telnet;

  for(i = 0;i < CURL_NTELOPTS;i++) {
    if(i==CURL_TELOPT_ECHO)
      continue;

    if(tn->us_preferred[i] == CURL_YES)
      set_local_option(conn, i, CURL_YES);

    if(tn->him_preferred[i] == CURL_YES)
      set_remote_option(conn, i, CURL_YES);
  }
}